

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

int linfgets(lindef *lin,uchar *buf,uint siz)

{
  long lVar1;
  char *pcVar2;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  uchar *nxt;
  uchar *p;
  long startpos;
  int ret;
  char *local_38;
  char *local_30;
  
  lVar1 = ftell(*(FILE **)(in_RDI + 0xd0));
  pcVar2 = fgets(in_RSI,in_EDX,*(FILE **)(in_RDI + 0xd0));
  local_30 = in_RSI;
  if ((pcVar2 != (char *)0x0) != 0) {
    while( true ) {
      bVar3 = false;
      if ((*local_30 != '\0') && (bVar3 = false, *local_30 != '\r')) {
        bVar3 = *local_30 != '\n';
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    local_38 = local_30;
    if (*local_30 != '\0') {
      do {
        local_38 = local_38 + 1;
        bVar3 = true;
        if (*local_38 != '\r') {
          bVar3 = *local_38 == '\n';
        }
      } while (bVar3);
      if (*local_38 == '\0') {
        local_30[1] = '\0';
      }
      else {
        local_30[1] = '\0';
        fseek(*(FILE **)(in_RDI + 0xd0),(long)(local_38 + (lVar1 - (long)in_RSI)),0);
      }
    }
  }
  return (uint)(pcVar2 != (char *)0x0);
}

Assistant:

int linfgets(lindef *lin, uchar *buf, uint siz)
{
    int    ret;
    long   startpos;
    uchar *p;
#   define  linf ((linfdef *)lin)

    /* note the seek offset at the start of the line */
    startpos = osfpos(linf->linffp);

    /* read the next line */
    ret = (osfgets((char *)buf, siz, linf->linffp) != 0);
    if (!ret)
        return ret;

    /* scan for non-standard line endings */
    for (p = buf ; *p != '\0' && *p != '\r' && *p != '\n' ; ++p) ;
    if (*p != '\0')
    {
        uchar *nxt;
        
        /* 
         *   Scan for non-line-ending characters after this line-ending
         *   character.  If we find any, we must have non-standard newline
         *   conventions in this file.  To be tolerant of these, seek back
         *   to the start of the next line in these cases and read the
         *   next line from the new location. 
         */
        for (nxt = p + 1 ; *nxt == '\r' || *nxt == '\n' ; ++nxt) ;
        if (*nxt == '\0')
        {
            /* 
             *   we had only line-ending characters after the first
             *   line-ending character -- simply end the line after the
             *   first line-ending character 
             */
            *(p+1) = '\0';
        }
        else
        {
            /*
             *   We had a line-ending character in the middle of other
             *   text, so we must have a file that doesn't conform to
             *   local newline conventions.  Seek back to the next
             *   character following the last line-ending character so
             *   that we start the next line here, and end the current
             *   line after the first line-ending character. 
             */
            *(p+1) = '\0';
            osfseek(linf->linffp, startpos + (nxt - buf), OSFSK_SET);
        }
    }

    /* return the result */
    return ret;

#   undef linf
}